

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pd~.c
# Opt level: O0

void pd_tilde_tick(t_pd_tilde *x)

{
  int iVar1;
  t_atom *ptVar2;
  t_atom *vec;
  int local_18;
  int n;
  int i;
  int messstart;
  t_pd_tilde *x_local;
  
  n = 0;
  iVar1 = binbuf_getnatom(x->x_binbuf);
  ptVar2 = binbuf_getvec(x->x_binbuf);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    if (ptVar2[local_18].a_type == A_SEMI) {
      if ((n < local_18) && (ptVar2[n].a_type == A_SYMBOL)) {
        outlet_anything(x->x_outlet1,ptVar2[n].a_w.w_symbol,local_18 - (n + 1),ptVar2 + (n + 1));
      }
      else if (n < local_18) {
        outlet_list(x->x_outlet1,(t_symbol *)0x0,local_18 - n,ptVar2 + n);
      }
      n = local_18 + 1;
    }
  }
  binbuf_clear(x->x_binbuf);
  return;
}

Assistant:

static void pd_tilde_tick(t_pd_tilde *x)
{
    int messstart = 0, i, n;
    t_atom *vec;
    /* binbuf_print(b); */
    n = binbuf_getnatom(x->x_binbuf);
    vec = binbuf_getvec(x->x_binbuf);
    for (i = 0; i < n; i++)
    {
        if (vec[i].a_type == A_SEMI)
        {
            if (i > messstart && vec[messstart].a_type == A_SYMBOL)
                outlet_anything(x->x_outlet1, vec[messstart].a_w.w_symbol,
                    i-(messstart+1), vec+(messstart+1));
            else if (i > messstart)
                outlet_list(x->x_outlet1, 0, i-messstart, vec+messstart);
            messstart = i+1;
        }
    }
    binbuf_clear(x->x_binbuf);
}